

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

double __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::GetDensity(ChElementBeamTaperedTimoshenko *this)

{
  double in_XMM0_Qa;
  __shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  double local_20;
  double local_18;
  
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_30,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionA).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_30._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[0xb])();
  local_18 = in_XMM0_Qa;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::__shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_30,
                 &(((this->tapered_section).
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->sectionB).
                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                );
  (*((local_30._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
    super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[0xb])();
  local_20 = in_XMM0_Qa;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return (local_20 + local_18) * 0.5;
}

Assistant:

double ChElementBeamTaperedTimoshenko::GetDensity() {
    double mu1 = this->tapered_section->GetSectionA()->GetMassPerUnitLength();
    double mu2 = this->tapered_section->GetSectionB()->GetMassPerUnitLength();
    double mu = (mu1 + mu2) / 2.0;

    return mu;
}